

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O0

Status __thiscall
spvtools::opt::TrimCapabilitiesPass::TrimUnrequiredExtensions
          (TrimCapabilitiesPass *this,ExtensionSet *required_extensions)

{
  bool bVar1;
  bool bVar2;
  Extension value;
  Status SVar3;
  IRContext *pIVar4;
  AssemblyGrammar *grammar;
  undefined1 local_78 [4];
  Extension extension;
  iterator __end2;
  iterator __begin2;
  ExtensionSet *__range2;
  undefined1 local_38 [7];
  bool modified_module;
  ExtensionSet supported_extensions;
  ExtensionSet *required_extensions_local;
  TrimCapabilitiesPass *this_local;
  
  supported_extensions.size_ = (size_t)required_extensions;
  pIVar4 = Pass::context(&this->super_Pass);
  grammar = IRContext::grammar(pIVar4);
  anon_unknown_0::getExtensionsRelatedTo
            ((ExtensionSet *)local_38,&this->supportedCapabilities_,grammar);
  bVar1 = false;
  EnumSet<spvtools::Extension>::begin
            ((iterator *)&__end2.bucketOffset_,(EnumSet<spvtools::Extension> *)local_38);
  EnumSet<spvtools::Extension>::end((iterator *)local_78,(EnumSet<spvtools::Extension> *)local_38);
  while (bVar2 = EnumSet<spvtools::Extension>::Iterator::operator!=
                           ((Iterator *)&__end2.bucketOffset_,(Iterator *)local_78), bVar2) {
    value = EnumSet<spvtools::Extension>::Iterator::operator*((Iterator *)&__end2.bucketOffset_);
    bVar2 = EnumSet<spvtools::Extension>::contains
                      ((EnumSet<spvtools::Extension> *)supported_extensions.size_,value);
    if (!bVar2) {
      pIVar4 = Pass::context(&this->super_Pass);
      bVar2 = IRContext::RemoveExtension(pIVar4,value);
      if (bVar2) {
        bVar1 = true;
      }
    }
    EnumSet<spvtools::Extension>::Iterator::operator++((Iterator *)&__end2.bucketOffset_);
  }
  SVar3 = SuccessWithoutChange;
  if (bVar1) {
    SVar3 = SuccessWithChange;
  }
  EnumSet<spvtools::Extension>::~EnumSet((EnumSet<spvtools::Extension> *)local_38);
  return SVar3;
}

Assistant:

Pass::Status TrimCapabilitiesPass::TrimUnrequiredExtensions(
    const ExtensionSet& required_extensions) const {
  const auto supported_extensions =
      getExtensionsRelatedTo(supportedCapabilities_, context()->grammar());

  bool modified_module = false;
  for (auto extension : supported_extensions) {
    if (required_extensions.contains(extension)) {
      continue;
    }

    if (context()->RemoveExtension(extension)) {
      modified_module = true;
    }
  }

  return modified_module ? Pass::Status::SuccessWithChange
                         : Pass::Status::SuccessWithoutChange;
}